

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

AST * __thiscall
jsonnet::internal::anon_unknown_0::Parser::parseInfix
          (Parser *this,AST *lhs,Token *begin,uint max_precedence)

{
  Kind KVar1;
  bool bVar2;
  Token *pTVar3;
  ostream *poVar4;
  undefined8 uVar5;
  uint *puVar6;
  uint in_ECX;
  Index *in_RSI;
  long in_RDI;
  AST *rhs_1;
  AST *rhs;
  Token super;
  Token end_2;
  AST *obj;
  Token tailstrict_token;
  Fodder tailstrict_fodder;
  bool tailstrict;
  ArgParam *arg;
  iterator __end5;
  iterator __begin5;
  ArgParams *__range5;
  bool got_named;
  Token end_1;
  bool got_comma;
  ArgParams args;
  Identifier *id;
  Token field_id;
  AST **in_stack_00000790;
  Parser *in_stack_00000798;
  Token end;
  Token delim_1;
  Token delim;
  Token joined;
  AST *third;
  Fodder third_fodder;
  AST *second;
  Fodder second_fodder;
  AST *first;
  bool is_slice;
  Token op;
  stringstream ss;
  uint op_precedence;
  BinaryOp bop;
  Token *in_stack_fffffffffffff0f8;
  Token *in_stack_fffffffffffff100;
  Token *in_stack_fffffffffffff108;
  string *in_stack_fffffffffffff110;
  LocationRange *in_stack_fffffffffffff118;
  StaticError *in_stack_fffffffffffff120;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_fffffffffffff128;
  Index *in_stack_fffffffffffff130;
  Allocator *in_stack_fffffffffffff138;
  AST *in_stack_fffffffffffff140;
  Index *in_stack_fffffffffffff148;
  Allocator *in_stack_fffffffffffff150;
  AST *in_stack_fffffffffffff158;
  Index *in_stack_fffffffffffff160;
  LocationRange *in_stack_fffffffffffff168;
  Index *in_stack_fffffffffffff170;
  LocationRange *in_stack_fffffffffffff178;
  Index *in_stack_fffffffffffff180;
  bool *in_stack_fffffffffffff190;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_fffffffffffff198;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_fffffffffffff1a0;
  allocator<char> *args_8;
  Index *in_stack_fffffffffffff1b0;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_fffffffffffff1b8;
  Identifier *in_stack_fffffffffffff1c0;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_fffffffffffff1c8;
  Index *in_stack_fffffffffffff1d0;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *args_10;
  AST *local_d60;
  undefined8 in_stack_fffffffffffff2d8;
  Token *in_stack_fffffffffffff2e0;
  AST *in_stack_fffffffffffff2e8;
  char *in_stack_fffffffffffff4d8;
  Kind in_stack_fffffffffffff4e4;
  Parser *in_stack_fffffffffffff4e8;
  undefined1 local_a08 [29];
  string local_9eb;
  reference local_9c8;
  ArgParam *local_9c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_9b8;
  byte local_9a2;
  allocator<char> local_9a1;
  string local_9a0 [40];
  Token local_978;
  undefined1 local_8b8 [24];
  bool *in_stack_fffffffffffff760;
  string *in_stack_fffffffffffff768;
  ArgParams *in_stack_fffffffffffff770;
  Parser *in_stack_fffffffffffff778;
  Identifier *local_840 [34];
  StaticError local_730;
  undefined1 local_672;
  undefined1 local_58a;
  undefined1 local_3e2;
  AST *local_300;
  undefined1 local_2f8 [32];
  undefined1 local_2d8 [39];
  undefined1 local_2b1;
  undefined4 local_2b0;
  undefined1 local_1e9;
  stringstream local_1b8 [16];
  ostream local_1a8 [380];
  uint local_2c;
  undefined4 local_28;
  uint local_24;
  Index *local_18;
  
  local_24 = in_ECX;
  local_18 = in_RSI;
  do {
    local_28 = 3;
    local_2c = 0;
    pTVar3 = peek((Parser *)0x208b59);
    KVar1 = pTVar3->kind;
    if (((KVar1 == BRACE_L) || (KVar1 == BRACKET_L)) || (KVar1 - DOT < 2)) {
      local_2c = 2;
    }
    else {
      if ((KVar1 != OPERATOR) && (KVar1 != IN)) {
        return &local_18->super_AST;
      }
      peek((Parser *)0x208bc0);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff100,(char *)in_stack_fffffffffffff0f8);
      if (bVar2) {
        return &local_18->super_AST;
      }
      peek((Parser *)0x208be4);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff100,(char *)in_stack_fffffffffffff0f8);
      if (bVar2) {
        return &local_18->super_AST;
      }
      peek((Parser *)0x208c1f);
      bVar2 = op_is_binary((string *)in_stack_fffffffffffff108,&in_stack_fffffffffffff100->kind);
      if (!bVar2) {
        std::__cxx11::stringstream::stringstream(local_1b8);
        poVar4 = std::operator<<(local_1a8,"not a binary operator: ");
        pTVar3 = peek((Parser *)0x208c73);
        std::operator<<(poVar4,(string *)&pTVar3->data);
        local_1e9 = 1;
        uVar5 = __cxa_allocate_exception(0x60);
        peek((Parser *)0x208cb0);
        std::__cxx11::stringstream::str();
        StaticError::StaticError
                  (in_stack_fffffffffffff120,in_stack_fffffffffffff118,in_stack_fffffffffffff110);
        local_1e9 = 0;
        __cxa_throw(uVar5,&StaticError::typeinfo,StaticError::~StaticError);
      }
      puVar6 = (uint *)std::
                       map<jsonnet::internal::BinaryOp,_int,_std::less<jsonnet::internal::BinaryOp>,_std::allocator<std::pair<const_jsonnet::internal::BinaryOp,_int>_>_>
                       ::operator[]((map<jsonnet::internal::BinaryOp,_int,_std::less<jsonnet::internal::BinaryOp>,_std::allocator<std::pair<const_jsonnet::internal::BinaryOp,_int>_>_>
                                     *)in_stack_fffffffffffff140,
                                    (key_type *)in_stack_fffffffffffff138);
      local_2c = *puVar6;
    }
    if (local_24 <= local_2c) {
      return &local_18->super_AST;
    }
    pop((Parser *)in_stack_fffffffffffff118);
    switch(local_2b0) {
    case 0:
      parseObjectRemainder
                (in_stack_00000798,in_stack_00000790,(Token *)field_id.location.end.column);
      in_stack_fffffffffffff178 = *(LocationRange **)(in_RDI + 8);
      span(in_stack_fffffffffffff108,in_stack_fffffffffffff100);
      in_stack_fffffffffffff170 =
           (Index *)Allocator::
                    make<jsonnet::internal::ApplyBrace,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,jsonnet::internal::AST*&>
                              ((Allocator *)in_stack_fffffffffffff140,
                               (LocationRange *)in_stack_fffffffffffff138,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)in_stack_fffffffffffff130,(AST **)in_stack_fffffffffffff128,
                               (AST **)in_stack_fffffffffffff120);
      local_18 = in_stack_fffffffffffff170;
      LocationRange::~LocationRange((LocationRange *)0x209d9a);
      Token::~Token(in_stack_fffffffffffff100);
      break;
    default:
      poVar4 = std::operator<<((ostream *)&std::cerr,"Should not be here.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      abort();
    case 2:
      local_2d8._24_8_ = (AST *)0x0;
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)0x208e59);
      local_2f8._24_8_ = (AST *)0x0;
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)0x208e72);
      local_300 = (AST *)0x0;
      pTVar3 = peek((Parser *)0x208e8b);
      if (pTVar3->kind == BRACKET_R) {
        local_3e2 = 1;
        uVar5 = __cxa_allocate_exception(0x60);
        pop((Parser *)in_stack_fffffffffffff118);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff140,(char *)in_stack_fffffffffffff138,
                   (allocator<char> *)in_stack_fffffffffffff130);
        unexpected((Parser *)in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
                   (string *)in_stack_fffffffffffff2d8);
        local_3e2 = 0;
        __cxa_throw(uVar5,&StaticError::typeinfo,StaticError::~StaticError);
      }
      peek((Parser *)0x208fd9);
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff100,(char *)in_stack_fffffffffffff0f8);
      if (bVar2) {
        peek((Parser *)0x208fff);
        bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff100,(char *)in_stack_fffffffffffff0f8);
        if (bVar2) {
          local_2d8._24_8_ =
               parse((Parser *)in_stack_fffffffffffff168,
                     (uint)((ulong)in_stack_fffffffffffff160 >> 0x20));
        }
      }
      pTVar3 = peek((Parser *)0x20906c);
      if (pTVar3->kind == OPERATOR) {
        peek((Parser *)0x209082);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff100,(char *)in_stack_fffffffffffff0f8);
        if (!bVar2) goto LAB_0020914c;
        local_2b1 = 1;
        pop((Parser *)in_stack_fffffffffffff118);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::operator=(in_stack_fffffffffffff1a0,in_stack_fffffffffffff198);
        pTVar3 = peek((Parser *)0x2090e1);
        if (pTVar3->kind != BRACKET_R) {
          local_300 = parse((Parser *)in_stack_fffffffffffff168,
                            (uint)((ulong)in_stack_fffffffffffff160 >> 0x20));
        }
        Token::~Token(in_stack_fffffffffffff100);
      }
      else {
LAB_0020914c:
        pTVar3 = peek((Parser *)0x209159);
        if (pTVar3->kind == BRACKET_R) {
          local_2b1 = 0;
        }
        else {
          local_2b1 = 1;
          pop((Parser *)in_stack_fffffffffffff118);
          bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff100,(char *)in_stack_fffffffffffff0f8);
          if (bVar2) {
            local_58a = 1;
            uVar5 = __cxa_allocate_exception(0x60);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff140,(char *)in_stack_fffffffffffff138,
                       (allocator<char> *)in_stack_fffffffffffff130);
            unexpected((Parser *)in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
                       (string *)in_stack_fffffffffffff2d8);
            local_58a = 0;
            __cxa_throw(uVar5,&StaticError::typeinfo,StaticError::~StaticError);
          }
          std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::operator=(in_stack_fffffffffffff1a0,in_stack_fffffffffffff198);
          peek((Parser *)0x2092c4);
          bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffff100,(char *)in_stack_fffffffffffff0f8);
          if ((bVar2) && (pTVar3 = peek((Parser *)0x2092ea), pTVar3->kind != BRACKET_R)) {
            local_2f8._24_8_ =
                 parse((Parser *)in_stack_fffffffffffff168,
                       (uint)((ulong)in_stack_fffffffffffff160 >> 0x20));
          }
          pTVar3 = peek((Parser *)0x209343);
          if (pTVar3->kind != BRACKET_R) {
            pop((Parser *)in_stack_fffffffffffff118);
            bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffff100,(char *)in_stack_fffffffffffff0f8);
            if (bVar2) {
              local_672 = 1;
              uVar5 = __cxa_allocate_exception(0x60);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff140,(char *)in_stack_fffffffffffff138,
                         (allocator<char> *)in_stack_fffffffffffff130);
              unexpected((Parser *)in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0,
                         (string *)in_stack_fffffffffffff2d8);
              local_672 = 0;
              __cxa_throw(uVar5,&StaticError::typeinfo,StaticError::~StaticError);
            }
            std::
            vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
            ::operator=(in_stack_fffffffffffff1a0,in_stack_fffffffffffff198);
            pTVar3 = peek((Parser *)0x2094a3);
            if (pTVar3->kind != BRACKET_R) {
              local_300 = parse((Parser *)in_stack_fffffffffffff168,
                                (uint)((ulong)in_stack_fffffffffffff160 >> 0x20));
            }
            Token::~Token(in_stack_fffffffffffff100);
          }
          Token::~Token(in_stack_fffffffffffff100);
        }
      }
      popExpect(in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e4,in_stack_fffffffffffff4d8);
      args_10 = *(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  **)(in_RDI + 8);
      span(in_stack_fffffffffffff108,in_stack_fffffffffffff100);
      in_stack_fffffffffffff120 = &local_730;
      in_stack_fffffffffffff118 = (LocationRange *)&local_300;
      in_stack_fffffffffffff110 = (string *)local_2f8;
      in_stack_fffffffffffff108 = (Token *)(local_2f8 + 0x18);
      in_stack_fffffffffffff100 = (Token *)local_2d8;
      in_stack_fffffffffffff0f8 = (Token *)(local_2d8 + 0x18);
      in_stack_fffffffffffff1d0 =
           Allocator::
           make<jsonnet::internal::Index,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,bool&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                     ((Allocator *)in_stack_fffffffffffff180,in_stack_fffffffffffff178,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)in_stack_fffffffffffff170,(AST **)in_stack_fffffffffffff168,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)in_stack_fffffffffffff160,(bool *)in_stack_fffffffffffff158,
                      (AST **)in_stack_fffffffffffff1b0,in_stack_fffffffffffff1b8,
                      (AST **)in_stack_fffffffffffff1c0,in_stack_fffffffffffff1c8,
                      (AST **)in_stack_fffffffffffff1d0,args_10);
      local_18 = in_stack_fffffffffffff1d0;
      LocationRange::~LocationRange((LocationRange *)0x20962d);
      Token::~Token(in_stack_fffffffffffff100);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)in_stack_fffffffffffff110);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)in_stack_fffffffffffff110);
      break;
    case 6:
      popExpect(in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e4,in_stack_fffffffffffff4d8);
      in_stack_fffffffffffff1c8 =
           *(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             **)(in_RDI + 8);
      Token::data32_abi_cxx11_(in_stack_fffffffffffff0f8);
      in_stack_fffffffffffff1c0 =
           Allocator::makeIdentifier(in_stack_fffffffffffff138,(UString *)in_stack_fffffffffffff130)
      ;
      std::__cxx11::u32string::~u32string
                ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 in_stack_fffffffffffff100);
      in_stack_fffffffffffff1b8 =
           *(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             **)(in_RDI + 8);
      local_840[0] = in_stack_fffffffffffff1c0;
      span(in_stack_fffffffffffff108,in_stack_fffffffffffff100);
      in_stack_fffffffffffff0f8 = (Token *)local_840;
      in_stack_fffffffffffff1b0 =
           Allocator::
           make<jsonnet::internal::Index,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Identifier_const*&>
                     (in_stack_fffffffffffff150,(LocationRange *)in_stack_fffffffffffff148,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)in_stack_fffffffffffff140,(AST **)in_stack_fffffffffffff138,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)in_stack_fffffffffffff130,in_stack_fffffffffffff128,
                      (Identifier **)in_stack_fffffffffffff160);
      local_18 = in_stack_fffffffffffff1b0;
      LocationRange::~LocationRange((LocationRange *)0x2097df);
      Token::~Token(in_stack_fffffffffffff100);
      break;
    case 7:
      std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::vector
                ((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                  *)0x209883);
      args_8 = &local_9a1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff140,(char *)in_stack_fffffffffffff138,
                 (allocator<char> *)in_stack_fffffffffffff130);
      parseArgs(in_stack_fffffffffffff778,in_stack_fffffffffffff770,in_stack_fffffffffffff768,
                in_stack_fffffffffffff760);
      std::__cxx11::string::~string(local_9a0);
      std::allocator<char>::~allocator(&local_9a1);
      local_9a2 = 0;
      local_9b8._8_8_ = local_8b8;
      local_9b8._M_allocated_capacity =
           (size_type)
           std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
           begin((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                  *)in_stack_fffffffffffff0f8);
      local_9c0 = (ArgParam *)
                  std::
                  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                  ::end((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                         *)in_stack_fffffffffffff0f8);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
                                 *)in_stack_fffffffffffff100,
                                (__normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
                                 *)in_stack_fffffffffffff0f8), bVar2) {
        local_9c8 = __gnu_cxx::
                    __normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
                    ::operator*((__normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
                                 *)&local_9b8._M_allocated_capacity);
        if (local_9c8->id == (Identifier *)0x0) {
          if ((local_9a2 & 1) != 0) {
            local_9eb._1_1_ = 1;
            uVar5 = __cxa_allocate_exception(0x60);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff140,(char *)in_stack_fffffffffffff138,
                       (allocator<char> *)in_stack_fffffffffffff130);
            StaticError::StaticError
                      (in_stack_fffffffffffff120,in_stack_fffffffffffff118,in_stack_fffffffffffff110
                      );
            local_9eb._1_1_ = 0;
            __cxa_throw(uVar5,&StaticError::typeinfo,StaticError::~StaticError);
          }
        }
        else {
          local_9a2 = 1;
        }
        __gnu_cxx::
        __normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
        ::operator++((__normal_iterator<jsonnet::internal::ArgParam_*,_std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>_>
                      *)&local_9b8._M_allocated_capacity);
      }
      local_9eb._M_dataplus = (_Alloc_hider)0x0;
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
              *)0x209b20);
      pTVar3 = peek((Parser *)0x209b2d);
      if (pTVar3->kind == TAILSTRICT) {
        pop((Parser *)in_stack_fffffffffffff118);
        std::
        vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ::operator=(in_stack_fffffffffffff1a0,in_stack_fffffffffffff198);
        local_9eb._M_dataplus = (_Alloc_hider)0x1;
        Token::~Token(in_stack_fffffffffffff100);
      }
      span(in_stack_fffffffffffff108,in_stack_fffffffffffff100);
      in_stack_fffffffffffff100 = &local_978;
      in_stack_fffffffffffff110 = &local_9eb;
      in_stack_fffffffffffff108 = (Token *)local_a08;
      in_stack_fffffffffffff0f8 = (Token *)((long)&local_978.location.end.column + 7);
      in_stack_fffffffffffff180 =
           (Index *)Allocator::
                    make<jsonnet::internal::Apply,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>&,bool&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,bool&>
                              ((Allocator *)in_stack_fffffffffffff170,in_stack_fffffffffffff168,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)in_stack_fffffffffffff160,(AST **)in_stack_fffffffffffff158,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)in_stack_fffffffffffff150,
                               (vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                                *)in_stack_fffffffffffff148,in_stack_fffffffffffff190,
                               in_stack_fffffffffffff198,in_stack_fffffffffffff1a0,(bool *)args_8);
      local_18 = in_stack_fffffffffffff180;
      LocationRange::~LocationRange((LocationRange *)0x209c7a);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)in_stack_fffffffffffff110);
      Token::~Token(in_stack_fffffffffffff100);
      std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::
      ~vector((vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *)
              in_stack_fffffffffffff110);
      break;
    case 0xc:
      in_stack_fffffffffffff140 =
           parse((Parser *)in_stack_fffffffffffff168,
                 (uint)((ulong)in_stack_fffffffffffff160 >> 0x20));
      in_stack_fffffffffffff138 = *(Allocator **)(in_RDI + 8);
      local_d60 = in_stack_fffffffffffff140;
      span(in_stack_fffffffffffff108,(AST *)in_stack_fffffffffffff100);
      in_stack_fffffffffffff0f8 = (Token *)&local_d60;
      in_stack_fffffffffffff130 =
           (Index *)Allocator::
                    make<jsonnet::internal::Binary,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::BinaryOp&,jsonnet::internal::AST*&>
                              (in_stack_fffffffffffff150,(LocationRange *)in_stack_fffffffffffff148,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)in_stack_fffffffffffff140,(AST **)in_stack_fffffffffffff138,
                               (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                *)in_stack_fffffffffffff130,(BinaryOp *)in_stack_fffffffffffff128,
                               (AST **)in_stack_fffffffffffff160);
      local_18 = in_stack_fffffffffffff130;
      LocationRange::~LocationRange((LocationRange *)0x20a09c);
      break;
    case 0x1c:
      pTVar3 = peek((Parser *)0x209e02);
      if (pTVar3->kind == SUPER) {
        pop((Parser *)in_stack_fffffffffffff118);
        in_stack_fffffffffffff168 = *(LocationRange **)(in_RDI + 8);
        span(in_stack_fffffffffffff108,in_stack_fffffffffffff100);
        in_stack_fffffffffffff160 =
             (Index *)Allocator::
                      make<jsonnet::internal::InSuper,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&>
                                (in_stack_fffffffffffff150,
                                 (LocationRange *)in_stack_fffffffffffff148,
                                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                  *)in_stack_fffffffffffff140,(AST **)in_stack_fffffffffffff138,
                                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                  *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
        local_18 = in_stack_fffffffffffff160;
        LocationRange::~LocationRange((LocationRange *)0x209ea4);
        Token::~Token(in_stack_fffffffffffff100);
      }
      else {
        in_stack_fffffffffffff158 =
             parse((Parser *)in_stack_fffffffffffff168,
                   (uint)((ulong)in_stack_fffffffffffff160 >> 0x20));
        in_stack_fffffffffffff150 = *(Allocator **)(in_RDI + 8);
        in_stack_fffffffffffff2e8 = in_stack_fffffffffffff158;
        span(in_stack_fffffffffffff108,(AST *)in_stack_fffffffffffff100);
        in_stack_fffffffffffff0f8 = (Token *)&stack0xfffffffffffff2e8;
        in_stack_fffffffffffff148 =
             (Index *)Allocator::
                      make<jsonnet::internal::Binary,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::BinaryOp&,jsonnet::internal::AST*&>
                                (in_stack_fffffffffffff150,
                                 (LocationRange *)in_stack_fffffffffffff148,
                                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                  *)in_stack_fffffffffffff140,(AST **)in_stack_fffffffffffff138,
                                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                  *)in_stack_fffffffffffff130,(BinaryOp *)in_stack_fffffffffffff128,
                                 (AST **)in_stack_fffffffffffff160);
        local_18 = in_stack_fffffffffffff148;
        LocationRange::~LocationRange((LocationRange *)0x209fb7);
      }
    }
    Token::~Token(in_stack_fffffffffffff100);
  } while( true );
}

Assistant:

AST *parseInfix(AST *lhs, const Token &begin, unsigned max_precedence)
    {
        while (true) {

            BinaryOp bop = BOP_PLUS;
            unsigned op_precedence = 0;

            switch (peek().kind) {
                // Logical / arithmetic binary operator.
                case Token::IN:
                case Token::OPERATOR:
                    // These occur if the outer statement was an assert or array slice.
                    // Either way, we terminate the parsing here.
                    if (peek().data == ":" || peek().data == "::") {
                        return lhs;
                    }
                    if (!op_is_binary(peek().data, bop)) {
                        std::stringstream ss;
                        ss << "not a binary operator: " << peek().data;
                        throw StaticError(peek().location, ss.str());
                    }
                    op_precedence = precedence_map[bop];
                    break;

                // Index, Apply
                case Token::DOT:
                case Token::BRACKET_L:
                case Token::PAREN_L:
                case Token::BRACE_L:
                    op_precedence = APPLY_PRECEDENCE;
                    break;

                default:
                    // This happens when we reach EOF or the terminating token of an outer context.
                    return lhs;
            }

            // If higher precedence than the outer recursive call, let that handle it.
            if (op_precedence >= max_precedence)
                return lhs;

            Token op = pop();

            switch (op.kind) {
                case Token::BRACKET_L: {
                    bool is_slice;
                    AST *first = nullptr;
                    Fodder second_fodder;
                    AST *second = nullptr;
                    Fodder third_fodder;
                    AST *third = nullptr;

                    if (peek().kind == Token::BRACKET_R)
                        throw unexpected(pop(), "parsing index");

                    if (peek().data != ":" && peek().data != "::") {
                        first = parse(MAX_PRECEDENCE);
                    }

                    if (peek().kind == Token::OPERATOR && peek().data == "::") {
                        // Handle ::
                        is_slice = true;
                        Token joined = pop();
                        second_fodder = joined.fodder;

                        if (peek().kind != Token::BRACKET_R)
                            third = parse(MAX_PRECEDENCE);

                    } else if (peek().kind != Token::BRACKET_R) {
                        is_slice = true;
                        Token delim = pop();
                        if (delim.data != ":")
                            throw unexpected(delim, "parsing slice");

                        second_fodder = delim.fodder;

                        if (peek().data != ":" && peek().kind != Token::BRACKET_R)
                            second = parse(MAX_PRECEDENCE);

                        if (peek().kind != Token::BRACKET_R) {
                            Token delim = pop();
                            if (delim.data != ":")
                                throw unexpected(delim, "parsing slice");

                            third_fodder = delim.fodder;

                            if (peek().kind != Token::BRACKET_R)
                                third = parse(MAX_PRECEDENCE);
                        }
                    } else {
                        is_slice = false;
                    }
                    Token end = popExpect(Token::BRACKET_R);
                    lhs = alloc->make<Index>(span(begin, end),
                                             EMPTY_FODDER,
                                             lhs,
                                             op.fodder,
                                             is_slice,
                                             first,
                                             second_fodder,
                                             second,
                                             third_fodder,
                                             third,
                                             end.fodder);
                    break;
                }
                case Token::DOT: {
                    Token field_id = popExpect(Token::IDENTIFIER);
                    const Identifier *id = alloc->makeIdentifier(field_id.data32());
                    lhs = alloc->make<Index>(span(begin, field_id),
                                             EMPTY_FODDER,
                                             lhs,
                                             op.fodder,
                                             field_id.fodder,
                                             id);
                    break;
                }
                case Token::PAREN_L: {
                    ArgParams args;
                    bool got_comma;
                    Token end = parseArgs(args, "function argument", got_comma);
                    bool got_named = false;
                    for (const auto& arg : args) {
                        if (arg.id != nullptr) {
                            got_named = true;
                        } else {
                            if (got_named) {
                                throw StaticError(arg.expr->location, "Positional argument after a named argument is not allowed");
                            }
                        }
                    }
                    bool tailstrict = false;
                    Fodder tailstrict_fodder;
                    if (peek().kind == Token::TAILSTRICT) {
                        Token tailstrict_token = pop();
                        tailstrict_fodder = tailstrict_token.fodder;
                        tailstrict = true;
                    }
                    lhs = alloc->make<Apply>(span(begin, end),
                                             EMPTY_FODDER,
                                             lhs,
                                             op.fodder,
                                             args,
                                             got_comma,
                                             end.fodder,
                                             tailstrict_fodder,
                                             tailstrict);
                    break;
                }
                case Token::BRACE_L: {
                    AST *obj;
                    Token end = parseObjectRemainder(obj, op);
                    lhs = alloc->make<ApplyBrace>(span(begin, end), EMPTY_FODDER, lhs, obj);
                    break;
                }

                case Token::IN: {
                    if (peek().kind == Token::SUPER) {
                        Token super = pop();
                        lhs = alloc->make<InSuper>(
                            span(begin, super), EMPTY_FODDER, lhs, op.fodder, super.fodder);
                    } else {
                        AST *rhs = parse(op_precedence);
                        lhs = alloc->make<Binary>(
                            span(begin, rhs), EMPTY_FODDER, lhs, op.fodder, bop, rhs);
                    }
                    break;
                }

                case Token::OPERATOR: {
                    AST *rhs = parse(op_precedence);
                    lhs = alloc->make<Binary>(
                        span(begin, rhs), EMPTY_FODDER, lhs, op.fodder, bop, rhs);
                    break;
                }

                default: {
                    std::cerr << "Should not be here." << std::endl;
                    abort();
                }
            }
        }

        // (1 & ((1 + (1 * 1)) + 1)) & 1
        //
        //

/*
        // Allocate this on the heap to control stack growth.
        std::unique_ptr<Token> begin_(new Token(peek()));
        const Token &begin = *begin_;
*/
    }